

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O1

int common_setup(archive_write_filter *f)

{
  archive *a;
  int iVar1;
  undefined8 *puVar2;
  
  a = f->archive;
  puVar2 = (undefined8 *)calloc(1,0x148);
  if (puVar2 == (undefined8 *)0x0) {
    archive_set_error(a,0xc,"Out of memory");
    iVar1 = -0x1e;
  }
  else {
    f->data = puVar2;
    *puVar2 = 0x100000006;
    f->open = archive_compressor_xz_open;
    f->close = archive_compressor_xz_close;
    f->free = archive_compressor_xz_free;
    f->options = archive_compressor_xz_options;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
common_setup(struct archive_write_filter *f)
{
	struct private_data *data;
	struct archive_write *a = (struct archive_write *)f->archive;
	data = calloc(1, sizeof(*data));
	if (data == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}
	f->data = data;
	data->compression_level = LZMA_PRESET_DEFAULT;
	data->threads = 1;
	f->open = &archive_compressor_xz_open;
	f->close = archive_compressor_xz_close;
	f->free = archive_compressor_xz_free;
	f->options = &archive_compressor_xz_options;
	return (ARCHIVE_OK);
}